

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void prvTidyDefineTag(TidyDocImpl *doc,UserTagType tagType,ctmbstr name)

{
  uint uVar1;
  Parser *pPVar2;
  Dict *pDVar3;
  uint uVar4;
  
  uVar4 = tagType - tagtype_empty;
  if (((uVar4 < 8) && ((0x8bU >> (uVar4 & 0x1f) & 1) != 0)) && (name != (ctmbstr)0x0)) {
    uVar1 = *(uint *)(&DAT_001882e8 + (ulong)uVar4 * 4);
    pPVar2 = (Parser *)(&PTR_prvTidyParseBlock_001cfa90)[uVar4];
    pDVar3 = tagsLookup(doc,&doc->tags,name);
    if (pDVar3 == (Dict *)0x0) {
      pDVar3 = NewDict(doc,name);
      pDVar3->next = (doc->tags).declared_tag_list;
      (doc->tags).declared_tag_list = pDVar3;
    }
    if (pDVar3->id == TidyTag_UNKNOWN) {
      pDVar3->versions = 0xe000;
      pDVar3->model = pDVar3->model | uVar1;
      pDVar3->parser = pPVar2;
      pDVar3->chkattrs = (CheckAttribs *)0x0;
      pDVar3->attrvers = (AttrVersion *)0x0;
    }
  }
  return;
}

Assistant:

void TY_(DefineTag)( TidyDocImpl* doc, UserTagType tagType, ctmbstr name )
{
    Parser* parser = 0;
    uint cm = CM_UNKNOWN;
    uint vers = VERS_PROPRIETARY;

    switch (tagType)
    {
    case tagtype_empty:
        cm = CM_EMPTY|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseBlock);
        break;

    case tagtype_inline:
        cm = CM_INLINE|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseInline);
        break;

    case tagtype_block:
        cm = CM_BLOCK|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseBlock);
        break;

    case tagtype_pre:
        cm = CM_BLOCK|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParsePre);
        break;

    case tagtype_null:
        break;
    }
    if ( cm && parser )
        declare( doc, &doc->tags, name, vers, cm, parser, 0 );
}